

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx.cpp
# Opt level: O3

int __thiscall ncnn::Deconvolution_x86_avx::create_pipeline(Deconvolution_x86_avx *this,Option *opt)

{
  uint uVar1;
  int *piVar2;
  int _h;
  _func_int **pp_Var3;
  Layer *pLVar4;
  _func_int *p_Var5;
  int i;
  long lVar6;
  undefined4 *puVar7;
  int k;
  ulong uVar8;
  _func_int ***ppp_Var9;
  int _w;
  ulong uVar10;
  _func_int ***ppp_Var11;
  undefined4 *puVar12;
  ulong uVar13;
  ulong uVar14;
  Allocator *pAVar15;
  int k_1;
  ulong uVar16;
  _func_int ***ppp_Var17;
  _func_int ***ppp_Var18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ParamDict pd_5;
  ParamDict pd;
  ParamDict local_138;
  Mat local_128;
  Mat local_d8;
  Allocator *local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  void *local_58;
  ulong local_50;
  _func_int **local_48;
  ModelBinFromMatArray local_40;
  
  pp_Var3 = this->_vptr_Deconvolution_x86_avx;
  p_Var5 = pp_Var3[-3];
  switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var5)) {
  case 1:
    pLVar4 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_128);
    (*pLVar4->_vptr_Layer[2])(pLVar4,&local_128);
    break;
  case 2:
    pLVar4 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_128);
    ParamDict::set((ParamDict *)&local_128,0,**(float **)(&this->field_0x118 + (long)p_Var5));
    (*pLVar4->_vptr_Layer[2])(pLVar4,&local_128);
    goto LAB_00285775;
  case 3:
    pLVar4 = create_layer(0x36);
    ParamDict::ParamDict((ParamDict *)&local_128);
    ParamDict::set((ParamDict *)&local_128,0,**(float **)(&this->field_0x118 + (long)p_Var5));
    ParamDict::set((ParamDict *)&local_128,1,
                   *(float *)(*(long *)(&this->field_0x118 + (long)p_Var5) + 4));
    (*pLVar4->_vptr_Layer[2])(pLVar4,&local_128);
    goto LAB_00285775;
  case 4:
    pLVar4 = create_layer(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_128);
    (*pLVar4->_vptr_Layer[2])(pLVar4,&local_128);
    break;
  case 5:
    pLVar4 = create_layer(0x47);
    ParamDict::ParamDict((ParamDict *)&local_128);
    (*pLVar4->_vptr_Layer[2])(pLVar4,&local_128);
    break;
  case 6:
    pLVar4 = create_layer(0x43);
    ParamDict::ParamDict((ParamDict *)&local_128);
    ParamDict::set((ParamDict *)&local_128,0,**(float **)(&this->field_0x118 + (long)p_Var5));
    ParamDict::set((ParamDict *)&local_128,1,
                   *(float *)(*(long *)(&this->field_0x118 + (long)p_Var5) + 4));
    (*pLVar4->_vptr_Layer[2])(pLVar4,&local_128);
LAB_00285775:
    ParamDict::~ParamDict((ParamDict *)&local_128);
    goto LAB_00285784;
  default:
    pLVar4 = (Layer *)0x0;
    goto LAB_00285798;
  }
  ParamDict::~ParamDict((ParamDict *)&local_128);
LAB_00285784:
  (*pLVar4->_vptr_Layer[4])(pLVar4,opt);
  pp_Var3 = this->_vptr_Deconvolution_x86_avx;
LAB_00285798:
  this->activation = pLVar4;
  p_Var5 = pp_Var3[-3];
  uVar10 = (long)*(int *)(&this->field_0xd8 + (long)p_Var5) *
           (long)*(int *)(&this->field_0xd4 + (long)p_Var5);
  uVar1 = *(uint *)(&this->field_0xd0 + (long)p_Var5);
  _w = (int)uVar10;
  uVar13 = (long)*(int *)(&this->field_0x110 + (long)p_Var5) / (long)_w;
  uVar14 = (long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff) /
           (long)(int)uVar1;
  _h = (int)uVar14;
  uVar21 = 1;
  uVar13 = 1;
  if (opt->use_packing_layout == true) {
    uVar13 = (ulong)((uVar14 & 3) == 0) * 3 + 1;
    if ((uVar14 & 7) == 0) {
      uVar13 = 8;
    }
    uVar21 = (ulong)((uVar1 & 3) == 0) * 3 + 1;
    if ((uVar1 & 7) == 0) {
      uVar21 = 8;
    }
  }
  local_80 = uVar21;
  local_70 = uVar10;
  if (opt->use_sgemm_convolution == true) {
    pLVar4 = create_layer(0x4a);
    this->gemm = pLVar4;
    ParamDict::ParamDict(&local_138);
    uVar13 = local_80;
    ParamDict::set(&local_138,2,1);
    ParamDict::set(&local_138,3,0);
    ParamDict::set(&local_138,4,1);
    ParamDict::set(&local_138,5,0);
    ParamDict::set(&local_138,6,1);
    ParamDict::set(&local_138,7,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86_avx[-3]) * _w);
    ParamDict::set(&local_138,8,0);
    ParamDict::set(&local_138,9,_h);
    ParamDict::set(&local_138,10,-1);
    ParamDict::set(&local_138,0xb,0);
    ParamDict::set(&local_138,0xc,(int)uVar13);
    (*this->gemm->_vptr_Layer[2])(this->gemm,&local_138);
    local_128.cstep = 0;
    local_128.data = (Allocator *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize = SUB168(ZEXT816(0) << 0x40,4);
    local_128.elempack = 0;
    local_128.allocator = (Allocator *)local_128.data;
    local_128.dims = (int)local_128.refcount;
    local_128.w = local_128.refcount._4_4_;
    local_128._48_8_ = local_128.elemsize;
    local_128.c = local_128.elempack;
    Mat::reshape(&local_d8,(Mat *)(&this->field_0x160 + (long)this->_vptr_Deconvolution_x86_avx[-3])
                 ,_w,_h,*(int *)&((Mat *)(&this->field_0x160 +
                                         (long)this->_vptr_Deconvolution_x86_avx[-3]))[-2].data,
                 (Allocator *)0x0);
    Mat::create(&local_128,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86_avx[-3]) * _w,_h,4,
                (Allocator *)0x0);
    if (0 < _h) {
      local_78 = (long)local_128.w * local_128.elemsize;
      local_88 = (Allocator *)local_128.data;
      pp_Var3 = this->_vptr_Deconvolution_x86_avx;
      uVar10 = uVar13 & 0xffffffff;
      p_Var5 = pp_Var3[-3];
      uVar16 = 0;
      uVar21 = uVar13;
      do {
        if ((int)uVar21 <= *(int *)(&this->field_0xd0 + (long)p_Var5)) {
          ppp_Var9 = (_func_int ***)
                     ((long)(_func_int ***)local_d8.data +
                     CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) * uVar16 *
                     (long)local_d8.w);
          lVar23 = CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) * local_d8.cstep;
          ppp_Var17 = (_func_int ***)((long)(_func_int ***)local_128.data + local_78 * uVar16);
          lVar6 = 0;
          do {
            if (0 < (int)local_70) {
              uVar8 = 0;
              uVar21 = uVar10;
              ppp_Var18 = ppp_Var9;
              ppp_Var11 = ppp_Var9;
              do {
                do {
                  *(undefined4 *)ppp_Var17 = *(undefined4 *)ppp_Var18;
                  ppp_Var17 = (_func_int ***)((long)ppp_Var17 + 4);
                  uVar21 = uVar21 - 1;
                  ppp_Var18 = (_func_int ***)((long)ppp_Var18 + lVar23);
                } while (uVar21 != 0);
                uVar8 = uVar8 + 1;
                ppp_Var18 = (_func_int ***)((long)ppp_Var11 + 4);
                uVar21 = uVar10;
                ppp_Var11 = ppp_Var18;
              } while (uVar8 != (local_70 & 0xffffffff));
              p_Var5 = pp_Var3[-3];
            }
            lVar6 = lVar6 + uVar10;
            ppp_Var9 = (_func_int ***)((long)ppp_Var9 + lVar23 * uVar10);
          } while ((long)(lVar6 + (ulong)((int)uVar13 - 1)) <
                   (long)*(int *)(&this->field_0xd0 + (long)p_Var5));
        }
        uVar16 = uVar16 + 1;
        uVar21 = local_80;
      } while (uVar16 != (uVar14 & 0xffffffff));
    }
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,(int)local_d8.refcount);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_d8.data != (Allocator *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_128.refcount._4_4_,(int)local_128.refcount);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    local_d8.data = local_128.data;
    local_d8.refcount._0_4_ = (int)local_128.refcount;
    local_d8.refcount._4_4_ = local_128.refcount._4_4_;
    local_d8.elemsize._0_4_ = (undefined4)local_128.elemsize;
    local_d8.elemsize._4_4_ = (undefined4)(local_128.elemsize >> 0x20);
    local_d8.elempack = local_128.elempack;
    local_d8.allocator = local_128.allocator;
    local_d8.dims = local_128.dims;
    local_d8.w = local_128.w;
    local_d8.h = local_128.h;
    local_d8.d = local_128.d;
    local_d8.c = local_128.c;
    local_d8.cstep = local_128.cstep;
    pLVar4 = this->gemm;
    ModelBinFromMatArray::ModelBinFromMatArray(&local_40,&local_d8);
    (*pLVar4->_vptr_Layer[3])(pLVar4,&local_40);
    ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
    (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,(int)local_d8.refcount);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_d8.data != (Allocator *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_128.refcount._4_4_,(int)local_128.refcount);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_128.data != (Allocator *)0x0) {
            free(local_128.data);
          }
        }
        else {
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    ParamDict::~ParamDict(&local_138);
  }
  else {
    local_128.cstep = 0;
    local_128.data = (Allocator *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize = SUB168(ZEXT816(0) << 0x40,4);
    local_128.elempack = 0;
    iVar19 = 0;
    local_128.allocator = (Allocator *)local_128.data;
    local_128.dims = (int)local_128.refcount;
    local_128.w = local_128.refcount._4_4_;
    local_128._48_8_ = local_128.elemsize;
    local_128.c = local_128.elempack;
    local_68 = uVar13;
    Mat::create(&local_128,*(int *)(&this->field_0x18c + (long)p_Var5),4,(Allocator *)0x0);
    pp_Var3 = this->_vptr_Deconvolution_x86_avx;
    p_Var5 = pp_Var3[-3];
    uVar13 = uVar10 & 0xffffffff;
    if (0 < *(int *)(&this->field_0xd0 + (long)p_Var5) * _h) {
      lVar6 = *(long *)(&this->field_0x160 + (long)p_Var5);
      puVar7 = (undefined4 *)((long)local_128.data + uVar10 * 4 + -4);
      do {
        if (0 < _w) {
          uVar14 = 0;
          puVar12 = puVar7;
          do {
            *puVar12 = *(undefined4 *)(lVar6 + uVar14 * 4);
            uVar14 = uVar14 + 1;
            puVar12 = puVar12 + -1;
          } while (uVar13 != uVar14);
          p_Var5 = pp_Var3[-3];
        }
        iVar19 = iVar19 + 1;
        lVar6 = lVar6 + uVar10 * 4;
        puVar7 = puVar7 + uVar10;
      } while (iVar19 < *(int *)(&this->field_0xd0 + (long)p_Var5) * _h);
    }
    Mat::reshape(&local_d8,&local_128,_w,_h,*(int *)(&this->field_0xd0 + (long)p_Var5),
                 (Allocator *)0x0);
    uVar14 = local_68;
    iVar19 = (int)local_68;
    iVar20 = (int)uVar21;
    Mat::create(&this->weight_data_tm,_w,_h / iVar19,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86_avx[-3]) / iVar20,
                (ulong)(uint)(iVar19 * iVar20 * 4),iVar19 * iVar20,(Allocator *)0x0);
    local_48 = this->_vptr_Deconvolution_x86_avx;
    p_Var5 = local_48[-3];
    if (iVar20 <= *(int *)(&this->field_0xd0 + (long)p_Var5)) {
      uVar8 = uVar14 & 0xffffffff;
      local_50 = (ulong)(iVar20 - 1);
      local_58 = (this->weight_data_tm).data;
      local_60 = (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize;
      local_78 = (long)_h - (ulong)(iVar19 - 1);
      pAVar15 = (Allocator *)0x0;
      uVar16 = uVar21;
      do {
        if ((int)uVar14 <= _h) {
          puVar7 = (undefined4 *)
                   ((int)(((ulong)pAVar15 & 0xffffffff) / (uVar16 & 0xffffffff)) * local_60 +
                   (long)local_58);
          lVar23 = local_d8.cstep * CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
          ppp_Var17 = (_func_int ***)((long)(_func_int ***)local_d8.data + lVar23 * (long)pAVar15);
          lVar6 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize)
          ;
          lVar22 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar14 = 0;
              ppp_Var9 = ppp_Var17;
              do {
                uVar16 = 0;
                uVar10 = uVar21;
                ppp_Var18 = ppp_Var9;
                ppp_Var11 = ppp_Var9;
                do {
                  do {
                    *puVar7 = *(undefined4 *)ppp_Var18;
                    puVar7 = puVar7 + 1;
                    uVar10 = uVar10 - 1;
                    ppp_Var18 = (_func_int ***)((long)ppp_Var18 + lVar23);
                  } while (uVar10 != 0);
                  uVar16 = uVar16 + 1;
                  ppp_Var18 = (_func_int ***)((long)ppp_Var11 + lVar6);
                  uVar10 = uVar21;
                  ppp_Var11 = ppp_Var18;
                } while (uVar16 != uVar8);
                uVar14 = uVar14 + 1;
                ppp_Var9 = (_func_int ***)((long)ppp_Var9 + 4);
              } while (uVar14 != uVar13);
            }
            lVar22 = lVar22 + uVar8;
            ppp_Var17 = (_func_int ***)((long)ppp_Var17 + lVar6 * uVar8);
            uVar10 = local_70;
          } while (lVar22 < local_78);
          p_Var5 = local_48[-3];
          uVar14 = local_68;
          uVar16 = local_80;
          local_88 = pAVar15;
        }
        pAVar15 = (Allocator *)((long)&pAVar15->_vptr_Allocator + uVar21);
      } while ((long)((long)&pAVar15->_vptr_Allocator + local_50) <
               (long)*(int *)(&this->field_0xd0 + (long)p_Var5));
    }
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,(int)local_d8.refcount);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_d8.data != (Allocator *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_128.refcount._4_4_,(int)local_128.refcount);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_128.data != (Allocator *)0x0) {
            free(local_128.data);
          }
        }
        else {
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (opt->lightmode == true) {
    p_Var5 = this->_vptr_Deconvolution_x86_avx[-3];
    piVar2 = *(int **)(&this->field_0x168 + (long)p_Var5);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x180 + (long)p_Var5) == (long *)0x0) {
          if (*(void **)(&this->field_0x160 + (long)p_Var5) != (void *)0x0) {
            free(*(void **)(&this->field_0x160 + (long)p_Var5));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x180 + (long)p_Var5) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var5) = 0;
    *(undefined8 *)(&this->field_0x16c + (long)p_Var5) = 0;
    *(undefined8 *)(&this->field_0x174 + (long)p_Var5) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var5) = 0;
    *(undefined8 *)(&this->field_0x168 + (long)p_Var5) = 0;
    *(undefined8 *)(&this->field_0x188 + (long)p_Var5) = 0;
    *(undefined8 *)(&this->field_0x190 + (long)p_Var5) = 0;
    *(undefined4 *)(&this->field_0x198 + (long)p_Var5) = 0;
  }
  return 0;
}

Assistant:

int Deconvolution_x86_avx::create_pipeline(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    const int maxk = kernel_w * kernel_h;
    int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 1);                 // transA
        pd.set(3, 0);                 // transB
        pd.set(4, 1);                 // constantA
        pd.set(5, 0);                 // constantB
        pd.set(6, 1);                 // constantC
        pd.set(7, maxk * num_output); // M = maxk*num_output
        pd.set(8, 0);                 // N = size
        pd.set(9, num_input);         // K = inch
        pd.set(10, -1);               // constant_broadcast_type_C = null
        pd.set(11, 0);                // output_N1M
        pd.set(12, out_elempack);

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-outch/pa-inch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_output, num_input);

            for (int p = 0; p < num_input; p += 1)
            {
                float* g00 = tmp.row(p);

                for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < out_elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q + i).row(p);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        ncnn::Mat weights[1];
        weights[0] = tmp;

        gemm->load_model(ModelBinFromMatArray(weights));

        gemm->create_pipeline(opt);
    }
    else
    {
        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < num_input * num_output; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

        // src = kw-kh-inch-outch
        // dst = pb-pa-kw-kh-inch/pa-outch/pb
        Mat weight_data_r2 = weight_data_transposed.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}